

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
jsoncons::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,staj_event_type tag)

{
  undefined1 in_SIL;
  ostream *in_RDI;
  
  switch(in_SIL) {
  case 0:
    std::operator<<(in_RDI,"key");
    break;
  case 1:
    std::operator<<(in_RDI,"string_value");
    break;
  case 2:
    std::operator<<(in_RDI,"byte_string_value");
    break;
  case 3:
    std::operator<<(in_RDI,"null_value");
    break;
  case 4:
    std::operator<<(in_RDI,"bool_value");
    break;
  case 5:
    std::operator<<(in_RDI,"int64_value");
    break;
  case 6:
    std::operator<<(in_RDI,"uint64_value");
    break;
  case 7:
    std::operator<<(in_RDI,"end_object");
    break;
  case 8:
    std::operator<<(in_RDI,"half_value");
    break;
  case 9:
    std::operator<<(in_RDI,"double_value");
    break;
  case 0xd:
    std::operator<<(in_RDI,"begin_object");
    break;
  case 0xe:
    std::operator<<(in_RDI,"begin_array");
    break;
  case 0xf:
    std::operator<<(in_RDI,"end_array");
  }
  return in_RDI;
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, staj_event_type tag)
{
    static constexpr const CharT* begin_array_name = JSONCONS_CSTRING_CONSTANT(CharT, "begin_array");
    static constexpr const CharT* end_array_name = JSONCONS_CSTRING_CONSTANT(CharT, "end_array");
    static constexpr const CharT* begin_object_name = JSONCONS_CSTRING_CONSTANT(CharT, "begin_object");
    static constexpr const CharT* end_object_name = JSONCONS_CSTRING_CONSTANT(CharT, "end_object");
    static constexpr const CharT* key_name = JSONCONS_CSTRING_CONSTANT(CharT, "key");
    static constexpr const CharT* string_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "string_value");
    static constexpr const CharT* byte_string_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "byte_string_value");
    static constexpr const CharT* null_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "null_value");
    static constexpr const CharT* bool_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "bool_value");
    static constexpr const CharT* uint64_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "uint64_value");
    static constexpr const CharT* int64_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "int64_value");
    static constexpr const CharT* half_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "half_value");
    static constexpr const CharT* double_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "double_value");

    switch (tag)
    {
        case staj_event_type::begin_array:
        {
            os << begin_array_name;
            break;
        }
        case staj_event_type::end_array:
        {
            os << end_array_name;
            break;
        }
        case staj_event_type::begin_object:
        {
            os << begin_object_name;
            break;
        }
        case staj_event_type::end_object:
        {
            os << end_object_name;
            break;
        }
        case staj_event_type::key:
        {
            os << key_name;
            break;
        }
        case staj_event_type::string_value:
        {
            os << string_value_name;
            break;
        }
        case staj_event_type::byte_string_value:
        {
            os << byte_string_value_name;
            break;
        }
        case staj_event_type::null_value:
        {
            os << null_value_name;
            break;
        }
        case staj_event_type::bool_value:
        {
            os << bool_value_name;
            break;
        }
        case staj_event_type::int64_value:
        {
            os << int64_value_name;
            break;
        }
        case staj_event_type::uint64_value:
        {
            os << uint64_value_name;
            break;
        }
        case staj_event_type::half_value:
        {
            os << half_value_name;
            break;
        }
        case staj_event_type::double_value:
        {
            os << double_value_name;
            break;
        }
    }
    return os;
}